

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     BinaryUpdateLoop<duckdb::ArgMinMaxState<duckdb::hugeint_t,int>,duckdb::hugeint_t,int,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (hugeint_t *adata,AggregateInputData *aggr_input_data,int *bdata,
               ArgMinMaxState<duckdb::hugeint_t,_int> *state,idx_t count,SelectionVector *asel,
               SelectionVector *bsel,ValidityMask *avalidity,ValidityMask *bvalidity)

{
  int iVar1;
  unsigned_long *puVar2;
  unsigned_long *puVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  int64_t iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  hugeint_t *phVar11;
  
  puVar2 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  puVar3 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar2 == (unsigned_long *)0x0 && puVar3 == (unsigned_long *)0x0) {
    if (count != 0) {
      psVar4 = asel->sel_vector;
      psVar5 = bsel->sel_vector;
      bVar10 = (state->super_ArgMinMaxStateBase).is_initialized;
      uVar9 = 0;
      do {
        uVar8 = uVar9;
        if (psVar4 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar4[uVar9];
        }
        uVar7 = uVar9;
        if (psVar5 != (sel_t *)0x0) {
          uVar7 = (ulong)psVar5[uVar9];
        }
        phVar11 = adata + uVar8;
        if ((bVar10 & 1) == 0) {
          iVar6 = phVar11->upper;
          (state->arg).lower = phVar11->lower;
          (state->arg).upper = iVar6;
          state->value = bdata[uVar7];
          (state->super_ArgMinMaxStateBase).is_initialized = true;
          bVar10 = 1;
        }
        else {
          iVar1 = bdata[uVar7];
          if (state->value < iVar1) {
            iVar6 = phVar11->upper;
            (state->arg).lower = phVar11->lower;
            (state->arg).upper = iVar6;
            state->value = iVar1;
          }
        }
        uVar9 = uVar9 + 1;
      } while (count != uVar9);
    }
  }
  else if (count != 0) {
    psVar4 = asel->sel_vector;
    psVar5 = bsel->sel_vector;
    uVar9 = 0;
    do {
      uVar8 = uVar9;
      if (psVar4 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar4[uVar9];
      }
      uVar7 = uVar9;
      if (psVar5 != (sel_t *)0x0) {
        uVar7 = (ulong)psVar5[uVar9];
      }
      if (((puVar2 == (unsigned_long *)0x0) || ((puVar2[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0)) &&
         ((puVar3 == (unsigned_long *)0x0 || ((puVar3[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0)))) {
        phVar11 = adata + uVar8;
        if ((state->super_ArgMinMaxStateBase).is_initialized == false) {
          iVar6 = phVar11->upper;
          (state->arg).lower = phVar11->lower;
          (state->arg).upper = iVar6;
          state->value = bdata[uVar7];
          (state->super_ArgMinMaxStateBase).is_initialized = true;
        }
        else {
          iVar1 = bdata[uVar7];
          if (state->value < iVar1) {
            iVar6 = phVar11->upper;
            (state->arg).lower = phVar11->lower;
            (state->arg).upper = iVar6;
            state->value = iVar1;
          }
        }
      }
      uVar9 = uVar9 + 1;
    } while (count != uVar9);
  }
  return;
}

Assistant:

static inline void BinaryUpdateLoop(const A_TYPE *__restrict adata, AggregateInputData &aggr_input_data,
	                                    const B_TYPE *__restrict bdata, STATE_TYPE *__restrict state, idx_t count,
	                                    const SelectionVector &asel, const SelectionVector &bsel,
	                                    ValidityMask &avalidity, ValidityMask &bvalidity) {
		AggregateBinaryInput input(aggr_input_data, avalidity, bvalidity);
		if (OP::IgnoreNull() && (!avalidity.AllValid() || !bvalidity.AllValid())) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				if (avalidity.RowIsValid(input.lidx) && bvalidity.RowIsValid(input.ridx)) {
					OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*state, adata[input.lidx], bdata[input.ridx],
					                                                       input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*state, adata[input.lidx], bdata[input.ridx],
				                                                       input);
			}
		}
	}